

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
fasthuf_decode(_internal_exr_context *pctxt,FastHufDecoder *fhd,uint8_t *src,int numSrcBits,
              uint16_t *dst,int numDstElems)

{
  uint16_t uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  byte bVar18;
  uint uVar19;
  ulong *puVar20;
  char *pcVar21;
  exr_result_t eVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong *puVar32;
  undefined1 in_XMM0 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar55;
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar54 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  long lVar41;
  
  auVar16 = _DAT_0012a0e0;
  auVar15 = _DAT_0012a0c0;
  auVar14 = _DAT_0012a0b0;
  auVar13 = _DAT_0012a0a0;
  uVar17 = numSrcBits - 0x80;
  if (0 < numDstElems) {
    uVar2 = *(ulong *)src;
    uVar31 = *(ulong *)(src + 8);
    uVar27 = uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
             (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
             (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 | (uVar31 & 0xff00) << 0x28 |
             uVar31 << 0x38;
    uVar31 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    puVar20 = (ulong *)(src + 0x10);
    uVar2 = fhd->_tableMin;
    iVar25 = 0x40;
    uVar28 = 0;
    iVar23 = 0x40;
    do {
      if (uVar31 < uVar2) {
        lVar30 = -0x32;
        do {
          lVar41 = lVar30;
          lVar30 = lVar41 + 1;
        } while (uVar31 < fhd->_ljOffset[lVar41 + 5]);
        uVar24 = lVar41 + 0x41;
        if ((fhd->_maxCodeLength < uVar24) ||
           (uVar29 = (uVar31 >> (-(char)(lVar41 + 1) & 0x3fU)) +
                     *(long *)(fhd->_lookupSymbol + lVar41 * 2 + 0xc),
           (ulong)(long)fhd->_numSymbols <= uVar29)) {
          if (pctxt != (_internal_exr_context *)0x0) {
            pcVar21 = "Huffman decode error (Decoded an invalid symbol)";
            goto LAB_0010ff94;
          }
          goto LAB_0010ffa5;
        }
        uVar19 = fhd->_idToSymbol[uVar29];
      }
      else {
        uVar24 = (ulong)(uint)(fhd->_lookupSymbol[uVar31 >> 0x32] >> 0x18);
        uVar19 = fhd->_lookupSymbol[uVar31 >> 0x32] & 0xffffff;
      }
      uVar31 = uVar31 << ((byte)uVar24 & 0x3f);
      iVar25 = iVar25 - (int)uVar24;
      if (uVar19 == fhd->_rleSymbol) {
        if (iVar25 < 8) {
          iVar26 = 0x40 - iVar25;
          uVar31 = uVar27 >> ((byte)iVar25 & 0x3f) | uVar31;
          iVar25 = iVar23;
          iVar52 = iVar23 - iVar26;
          if (iVar23 < iVar26) {
            if ((int)uVar17 < 0x40) {
              if ((int)uVar17 < 1) {
                uVar27 = 0;
                uVar17 = 0;
              }
              else {
                uVar19 = uVar17 + 8;
                bVar18 = 0x38;
                uVar27 = 0;
                puVar32 = puVar20;
                do {
                  uVar27 = uVar27 | (ulong)(byte)*puVar32 << (bVar18 & 0x3f);
                  puVar32 = (ulong *)((long)puVar32 + 1);
                  bVar18 = bVar18 - 8;
                  uVar19 = uVar19 - 8;
                } while (8 < uVar19);
                puVar20 = (ulong *)((long)puVar20 + (ulong)(uVar17 - 1 >> 3) + 1);
                uVar17 = 0;
              }
            }
            else {
              uVar27 = *puVar20;
              uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                       (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                       (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                       (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
              puVar20 = puVar20 + 1;
              uVar17 = uVar17 - 0x40;
            }
            iVar26 = iVar26 - iVar23;
            iVar25 = 0x40;
            uVar31 = uVar31 | uVar27 >> (-(char)iVar26 & 0x3fU);
            iVar52 = 0x40 - iVar26;
          }
          iVar23 = iVar52;
          uVar27 = uVar27 << ((byte)iVar26 & 0x3f);
          if (iVar25 <= iVar26) {
            uVar27 = 0;
          }
          iVar25 = 0x40;
        }
        if ((int)uVar28 < 1) {
          if (pctxt != (_internal_exr_context *)0x0) {
            pcVar21 = "Huffman decode error (RLE code with no previous symbol)";
LAB_0010ff94:
            (*pctxt->print_error)(pctxt,0x17,pcVar21);
            return 0x17;
          }
          goto LAB_0010ffa5;
        }
        bVar18 = (byte)(uVar31 >> 0x38);
        uVar19 = bVar18 + uVar28;
        if (numDstElems < (int)uVar19) {
          if (pctxt != (_internal_exr_context *)0x0) {
            pcVar21 = "Huffman decode error (Symbol run beyond expected output buffer length)";
            goto LAB_0010ff94;
          }
          goto LAB_0010ffa5;
        }
        if (uVar31 >> 0x38 == 0) {
          if (pctxt != (_internal_exr_context *)0x0) {
            pcVar21 = "Huffman decode error (Invalid RLE length)";
            goto LAB_0010ff94;
          }
          goto LAB_0010ffa5;
        }
        uVar1 = dst[(ulong)uVar28 - 1];
        lVar30 = (uVar31 >> 0x38) - 1;
        auVar38._8_4_ = (int)lVar30;
        auVar38._0_8_ = lVar30;
        auVar38._12_4_ = (int)((ulong)lVar30 >> 0x20);
        lVar30 = (ulong)uVar28 * 2;
        auVar38 = auVar38 ^ auVar16;
        uVar24 = 0;
        auVar40 = auVar15;
        auVar42 = auVar14;
        auVar43 = auVar13;
        auVar44 = _DAT_0012a090;
        do {
          auVar45 = auVar40 ^ auVar16;
          iVar52 = auVar38._0_4_;
          iVar51 = -(uint)(iVar52 < auVar45._0_4_);
          iVar26 = auVar38._4_4_;
          auVar46._4_4_ = -(uint)(iVar26 < auVar45._4_4_);
          iVar56 = auVar38._8_4_;
          iVar55 = -(uint)(iVar56 < auVar45._8_4_);
          iVar39 = auVar38._12_4_;
          auVar46._12_4_ = -(uint)(iVar39 < auVar45._12_4_);
          auVar33._4_4_ = iVar51;
          auVar33._0_4_ = iVar51;
          auVar33._8_4_ = iVar55;
          auVar33._12_4_ = iVar55;
          auVar57 = pshuflw(in_XMM15,auVar33,0xe8);
          auVar34._4_4_ = -(uint)(auVar45._4_4_ == iVar26);
          auVar34._12_4_ = -(uint)(auVar45._12_4_ == iVar39);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar33 = pshuflw(in_XMM0,auVar34,0xe8);
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar58 = pshuflw(auVar57,auVar46,0xe8);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar58 | auVar33 & auVar57) ^ auVar45;
          auVar45 = packssdw(auVar45,auVar45);
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30) = uVar1;
          }
          auVar58._4_4_ = iVar51;
          auVar58._0_4_ = iVar51;
          auVar58._8_4_ = iVar55;
          auVar58._12_4_ = iVar55;
          auVar46 = auVar34 & auVar58 | auVar46;
          auVar33 = packssdw(auVar46,auVar46);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar57,auVar33 ^ auVar57);
          if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30 + 2) = uVar1;
          }
          auVar33 = auVar42 ^ auVar16;
          iVar51 = -(uint)(iVar52 < auVar33._0_4_);
          auVar53._4_4_ = -(uint)(iVar26 < auVar33._4_4_);
          iVar55 = -(uint)(iVar56 < auVar33._8_4_);
          auVar53._12_4_ = -(uint)(iVar39 < auVar33._12_4_);
          auVar47._4_4_ = iVar51;
          auVar47._0_4_ = iVar51;
          auVar47._8_4_ = iVar55;
          auVar47._12_4_ = iVar55;
          iVar51 = -(uint)(auVar33._4_4_ == iVar26);
          iVar55 = -(uint)(auVar33._12_4_ == iVar39);
          auVar7._4_4_ = iVar51;
          auVar7._0_4_ = iVar51;
          auVar7._8_4_ = iVar55;
          auVar7._12_4_ = iVar55;
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar33 = auVar7 & auVar47 | auVar53;
          auVar33 = packssdw(auVar33,auVar33);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar3,auVar33 ^ auVar3);
          if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30 + 4) = uVar1;
          }
          auVar33 = pshufhw(auVar33,auVar47,0x84);
          auVar8._4_4_ = iVar51;
          auVar8._0_4_ = iVar51;
          auVar8._8_4_ = iVar55;
          auVar8._12_4_ = iVar55;
          auVar46 = pshufhw(auVar47,auVar8,0x84);
          auVar34 = pshufhw(auVar33,auVar53,0x84);
          auVar35._8_4_ = 0xffffffff;
          auVar35._0_8_ = 0xffffffffffffffff;
          auVar35._12_4_ = 0xffffffff;
          auVar35 = (auVar34 | auVar46 & auVar33) ^ auVar35;
          auVar33 = packssdw(auVar35,auVar35);
          if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30 + 6) = uVar1;
          }
          auVar33 = auVar43 ^ auVar16;
          iVar51 = -(uint)(iVar52 < auVar33._0_4_);
          auVar49._4_4_ = -(uint)(iVar26 < auVar33._4_4_);
          iVar55 = -(uint)(iVar56 < auVar33._8_4_);
          auVar49._12_4_ = -(uint)(iVar39 < auVar33._12_4_);
          auVar9._4_4_ = iVar51;
          auVar9._0_4_ = iVar51;
          auVar9._8_4_ = iVar55;
          auVar9._12_4_ = iVar55;
          auVar34 = pshuflw(auVar45,auVar9,0xe8);
          auVar36._0_4_ = -(uint)(auVar33._0_4_ == iVar52);
          auVar36._4_4_ = -(uint)(auVar33._4_4_ == iVar26);
          auVar36._8_4_ = -(uint)(auVar33._8_4_ == iVar56);
          auVar36._12_4_ = -(uint)(auVar33._12_4_ == iVar39);
          auVar48._4_4_ = auVar36._4_4_;
          auVar48._0_4_ = auVar36._4_4_;
          auVar48._8_4_ = auVar36._12_4_;
          auVar48._12_4_ = auVar36._12_4_;
          auVar45 = pshuflw(auVar36,auVar48,0xe8);
          auVar49._0_4_ = auVar49._4_4_;
          auVar49._8_4_ = auVar49._12_4_;
          auVar33 = pshuflw(auVar34,auVar49,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          in_XMM15 = (auVar33 | auVar45 & auVar34) ^ auVar4;
          auVar45 = packssdw(auVar45 & auVar34,in_XMM15);
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30 + 8) = uVar1;
          }
          auVar10._4_4_ = iVar51;
          auVar10._0_4_ = iVar51;
          auVar10._8_4_ = iVar55;
          auVar10._12_4_ = iVar55;
          auVar49 = auVar48 & auVar10 | auVar49;
          auVar33 = packssdw(auVar49,auVar49);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45,auVar33 ^ auVar5);
          if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30 + 10) = uVar1;
          }
          auVar45 = auVar44 ^ auVar16;
          iVar52 = -(uint)(iVar52 < auVar45._0_4_);
          auVar54._4_4_ = -(uint)(iVar26 < auVar45._4_4_);
          iVar56 = -(uint)(iVar56 < auVar45._8_4_);
          auVar54._12_4_ = -(uint)(iVar39 < auVar45._12_4_);
          auVar50._4_4_ = iVar52;
          auVar50._0_4_ = iVar52;
          auVar50._8_4_ = iVar56;
          auVar50._12_4_ = iVar56;
          iVar52 = -(uint)(auVar45._4_4_ == iVar26);
          iVar26 = -(uint)(auVar45._12_4_ == iVar39);
          auVar11._4_4_ = iVar52;
          auVar11._0_4_ = iVar52;
          auVar11._8_4_ = iVar26;
          auVar11._12_4_ = iVar26;
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar45 = auVar11 & auVar50 | auVar54;
          auVar45 = packssdw(auVar45,auVar45);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar6,auVar45 ^ auVar6);
          if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30 + 0xc) = uVar1;
          }
          auVar45 = pshufhw(auVar45,auVar50,0x84);
          auVar12._4_4_ = iVar52;
          auVar12._0_4_ = iVar52;
          auVar12._8_4_ = iVar26;
          auVar12._12_4_ = iVar26;
          auVar34 = pshufhw(auVar50,auVar12,0x84);
          auVar33 = pshufhw(auVar45,auVar54,0x84);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar37 = (auVar33 | auVar34 & auVar45) ^ auVar37;
          in_XMM0 = packssdw(auVar37,auVar37);
          if ((in_XMM0 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar24 + lVar30 + 0xe) = uVar1;
          }
          lVar41 = auVar40._8_8_;
          auVar40._0_8_ = auVar40._0_8_ + 8;
          auVar40._8_8_ = lVar41 + 8;
          lVar41 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + 8;
          auVar42._8_8_ = lVar41 + 8;
          lVar41 = auVar43._8_8_;
          auVar43._0_8_ = auVar43._0_8_ + 8;
          auVar43._8_8_ = lVar41 + 8;
          lVar41 = auVar44._8_8_;
          auVar44._0_8_ = auVar44._0_8_ + 8;
          auVar44._8_8_ = lVar41 + 8;
          uVar24 = uVar24 + 0x10;
        } while (((uint)bVar18 * 2 + 0xe & 0xfffffff0) != uVar24);
        uVar31 = uVar31 << 8;
        iVar25 = iVar25 + -8;
        uVar28 = uVar19;
      }
      else {
        dst[(int)uVar28] = (uint16_t)uVar19;
        uVar28 = uVar28 + 1;
      }
      if (iVar25 < 0x40) {
        iVar52 = 0x40 - iVar25;
        uVar31 = uVar27 >> ((byte)iVar25 & 0x3f) | uVar31;
        iVar26 = iVar23 - iVar52;
        if (iVar23 < iVar52) {
          if ((int)uVar17 < 0x40) {
            if ((int)uVar17 < 1) {
              uVar27 = 0;
              uVar17 = 0;
            }
            else {
              uVar19 = uVar17 + 8;
              bVar18 = 0x38;
              uVar27 = 0;
              puVar32 = puVar20;
              do {
                uVar27 = uVar27 | (ulong)(byte)*puVar32 << (bVar18 & 0x3f);
                puVar32 = (ulong *)((long)puVar32 + 1);
                bVar18 = bVar18 - 8;
                uVar19 = uVar19 - 8;
              } while (8 < uVar19);
              puVar20 = (ulong *)((long)puVar20 + (ulong)(uVar17 - 1 >> 3) + 1);
              uVar17 = 0;
            }
          }
          else {
            uVar27 = *puVar20;
            uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                     (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                     (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                     (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38;
            puVar20 = puVar20 + 1;
            uVar17 = uVar17 - 0x40;
          }
          iVar52 = iVar52 - iVar23;
          iVar23 = 0x40;
          iVar26 = 0x40 - iVar52;
          uVar31 = uVar31 | uVar27 >> (-(char)iVar52 & 0x3fU);
        }
        uVar27 = uVar27 << ((byte)iVar52 & 0x3f);
        if (iVar23 <= iVar52) {
          uVar27 = 0;
        }
        iVar25 = 0x40;
        iVar23 = iVar26;
      }
    } while ((int)uVar28 < numDstElems);
  }
  if (uVar17 == 0) {
    eVar22 = 0;
  }
  else if (pctxt == (_internal_exr_context *)0x0) {
LAB_0010ffa5:
    eVar22 = 0x17;
  }
  else {
    eVar22 = 0x17;
    (*pctxt->print_error)
              (pctxt,0x17,
               "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
               ,(ulong)uVar17);
  }
  return eVar22;
}

Assistant:

static exr_result_t
fasthuf_decode (
    const struct _internal_exr_context* pctxt,
    FastHufDecoder*                     fhd,
    const uint8_t*                      src,
    int                                 numSrcBits,
    uint16_t*                           dst,
    int                                 numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //

    const unsigned char* currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    uint64_t buffer        = READ64 (src);
    int      bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    uint64_t bufferBack        = READ64 ((src + sizeof (uint64_t)));
    int      bufferBackNumBits = 64;

    int dstIdx = 0;

    while (dstIdx < numDstElems)
    {
        int codeLen;
        int symbol;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (fhd->_tableMin <= buffer)
        {
            int tableIdx =
                fhd->_lookupSymbol[buffer >> (64 - TABLE_LOOKUP_BITS)];

            //
            // For invalid codes, _tableCodeLen[] should return 0. This
            // will cause the decoder to get stuck in the current spot
            // until we run out of elements, then barf that the codestream
            // is bad.  So we don't need to stick a condition like
            //     if (codeLen > _maxCodeLength) in this inner.
            //

            codeLen = tableIdx >> 24;
            symbol  = tableIdx & 0xffffff;
        }
        else
        {
            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            while (fhd->_ljBase[codeLen] >
                   buffer /* && codeLen <= _maxCodeLength */)
                codeLen++;

            if (codeLen > fhd->_maxCodeLength)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            uint64_t id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < (uint64_t) fhd->_numSymbols)
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }
        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == fhd->_rleSymbol)
        {
            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    64 - bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            int rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (dstIdx + rleCount > numDstElems)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (rleCount <= 0)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (int i = 0; i < rleCount; ++i)
                dst[dstIdx + i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < 64)
        {
            FastHufDecoder_refill (
                &buffer,
                64 - bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}